

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall re2::Prog::~Prog(Prog *this)

{
  DeleteDFA(this,&this->dfa_first_);
  DeleteDFA(this,&this->dfa_longest_);
  if (this->onepass_nodes_ != (uint8 *)0x0) {
    operator_delete__(this->onepass_nodes_);
  }
  if (this->inst_ != (Inst *)0x0) {
    operator_delete__(this->inst_);
  }
  Mutex::~Mutex(&this->dfa_mutex_);
  return;
}

Assistant:

Prog::~Prog() {
  DeleteDFA(&dfa_first_);
  DeleteDFA(&dfa_longest_);
  delete[] onepass_nodes_;
  delete[] inst_;
}